

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putcoluj.c
# Opt level: O0

int ffu4fi1(unsigned_long *input,long ntodo,double scale,double zero,uchar *output,int *status)

{
  unsigned_long uVar1;
  double dVar2;
  undefined1 auVar3 [16];
  double dvalue;
  long ii;
  int *status_local;
  uchar *output_local;
  double zero_local;
  double scale_local;
  long ntodo_local;
  unsigned_long *input_local;
  
  if ((((scale != 1.0) || (NAN(scale))) || (zero != 0.0)) || (NAN(zero))) {
    for (ii = 0; ii < ntodo; ii = ii + 1) {
      uVar1 = input[ii];
      auVar3._8_4_ = (int)(uVar1 >> 0x20);
      auVar3._0_8_ = uVar1;
      auVar3._12_4_ = 0x45300000;
      dVar2 = (((auVar3._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) - zero) / scale;
      if (-0.49 <= dVar2) {
        if (dVar2 <= 255.49) {
          output[ii] = (uchar)(int)(dVar2 + 0.5);
        }
        else {
          *status = -0xb;
          output[ii] = 0xff;
        }
      }
      else {
        *status = -0xb;
        output[ii] = '\0';
      }
    }
  }
  else {
    for (ii = 0; ii < ntodo; ii = ii + 1) {
      if (input[ii] < 0x100) {
        output[ii] = (uchar)input[ii];
      }
      else {
        *status = -0xb;
        output[ii] = 0xff;
      }
    }
  }
  return *status;
}

Assistant:

int ffu4fi1(unsigned long *input,  /* I - array of values to be converted  */
            long ntodo,            /* I - number of elements in the array  */
            double scale,          /* I - FITS TSCALn or BSCALE value      */
            double zero,           /* I - FITS TZEROn or BZERO  value      */
            unsigned char *output, /* O - output array of converted values */
            int *status)           /* IO - error status                    */
/*
  Copy input to output prior to writing output to a FITS file.
  Do datatype conversion and scaling if required.
*/
{
    long ii;
    double dvalue;

    if (scale == 1. && zero == 0.)
    {       
        for (ii = 0; ii < ntodo; ii++)
        {
            if (input[ii] > UCHAR_MAX)
            {
                *status = OVERFLOW_ERR;
                output[ii] = UCHAR_MAX;
            }
            else
                output[ii] = (unsigned char) input[ii];
        }
    }
    else
    {
        for (ii = 0; ii < ntodo; ii++)
        {
            dvalue = (input[ii] - zero) / scale;

            if (dvalue < DUCHAR_MIN)
            {
                *status = OVERFLOW_ERR;
                output[ii] = 0;
            }
            else if (dvalue > DUCHAR_MAX)
            {
                *status = OVERFLOW_ERR;
                output[ii] = UCHAR_MAX;
            }
            else
                output[ii] = (unsigned char) (dvalue + .5);
        }
    }
    return(*status);
}